

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent,SourceCodeInfo *source_code_info)

{
  Location *pLVar1;
  ulong uVar2;
  int iVar3;
  Location *pLVar4;
  RepeatedField<int> *this_00;
  bool is_soo;
  
  this->parser_ = parent->parser_;
  this->source_code_info_ = source_code_info;
  pLVar4 = (Location *)
           internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(source_code_info->field_0)._impl_.location_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::SourceCodeInfo_Location>);
  this->location_ = pLVar4;
  pLVar1 = parent->location_;
  if (pLVar1 != pLVar4) {
    this_00 = &(pLVar4->field_0)._impl_.path_;
    uVar2 = (this_00->soo_rep_).field_0.long_rep.elements_int;
    if ((uVar2 & 4) != 0) {
      internal::LongSooRep::elements((LongSooRep *)this_00);
    }
    is_soo = (uVar2 & 4) == 0;
    internal::SooRep::size(&this_00->soo_rep_,is_soo);
    iVar3 = internal::SooRep::size(&this_00->soo_rep_,is_soo);
    if ((iVar3 != 0) &&
       ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this_00);
    }
    RepeatedField<int>::set_size(this_00,(uVar2 & 4) == 0,0);
    RepeatedField<int>::MergeFrom(this_00,&(pLVar1->field_0)._impl_.path_);
  }
  RepeatedField<int>::Add
            (&(this->location_->field_0)._impl_.span_,(this->parser_->input_->current_).line);
  RepeatedField<int>::Add
            (&(this->location_->field_0)._impl_.span_,(this->parser_->input_->current_).column);
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent,
                                    SourceCodeInfo* source_code_info) {
  parser_ = parent.parser_;
  source_code_info_ = source_code_info;

  location_ = source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}